

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall capnp::compiler::Compiler::Impl::load(Impl *this,SchemaLoader *loader,uint64_t id)

{
  iterator iVar1;
  uint64_t local_18;
  
  local_18 = id;
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->nodesById)._M_h,&local_18);
  if ((iVar1.
       super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (*(long *)((long)iVar1.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                      ._M_cur + 0x10) != 0)) {
    Node::getBootstrapSchema((Node *)&stack0xfffffffffffffff0);
  }
  return;
}

Assistant:

void Compiler::Impl::load(const SchemaLoader& loader, uint64_t id) const {
  // We know that this load() is only called from the bootstrap loader which is already protected
  // by our mutex, so we can drop thread-safety.
  auto& self = const_cast<Compiler::Impl&>(*this);

  KJ_IF_SOME(node, self.findNode(id)) {
    node.getBootstrapSchema();
  }
}